

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

CallRef * __thiscall
wasm::Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  CallRef *this_00;
  MixedArena *this_01;
  
  this_01 = &this->wasm->allocator;
  this_00 = (CallRef *)MixedArena::allocSpace(this_01,0x40,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression._id = CallRefId;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  data = (Expression **)0x0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (this_00->operands).allocator = this_01;
  this_00->isReturn = false;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = type.id;
  this_00->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&this_00->operands
             ,args);
  this_00->isReturn = isReturn;
  CallRef::finalize(this_00);
  return this_00;
}

Assistant:

CallRef* makeCallRef(Expression* target,
                       const T& args,
                       Type type,
                       bool isReturn = false) {
    auto* call = wasm.allocator.alloc<CallRef>();
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }